

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void approxtest(void)

{
  int iVar1;
  double *x;
  double *y;
  long lVar2;
  double *x_00;
  double *yout;
  
  x = (double *)malloc(0x50);
  y = (double *)malloc(0x50);
  lVar2 = 1;
  do {
    iVar1 = (int)lVar2;
    x[lVar2 + -1] = (double)iVar1;
    y[lVar2 + -1] = (double)(iVar1 * iVar1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xb);
  x_00 = (double *)malloc(400);
  yout = (double *)malloc(400);
  linspace(x_00,0x32,*x,x[9]);
  approx(x,y,10,x_00,yout,0x32);
  mdisplay(x_00,1,0x32);
  mdisplay(yout,1,0x32);
  free(x);
  free(y);
  free(x_00);
  free(yout);
  return;
}

Assistant:

void approxtest() {
	int i,N, Nout;
	double *x,*y,*xout,*yout;

	N = 10;

	x = (double*) malloc(sizeof(double)*N);
	y = (double*) malloc(sizeof(double)*N);

	for(i = 0; i < N; ++i) {
		x[i] = (double) (i+1);
		y[i] = x[i] *x[i];
	}

	Nout = 50;

	xout = (double*) malloc(sizeof(double)*Nout);
	yout = (double*) malloc(sizeof(double)*Nout);

	linspace(xout,Nout,x[0],x[N-1]);

	/* x and y should be sorted in ascending order. x has all unique values
		xout contains equally spaced Nout values from lowest x[0]
		to highest x[N-1].Outputs y[out] are Nout interpolated values.
	*/

	approx(x,y,N,xout,yout,Nout);

	mdisplay(xout,1,Nout);
	mdisplay(yout,1,Nout);

	free(x);
	free(y);
	free(xout);
	free(yout);
}